

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_slider.cpp
# Opt level: O0

void QtMWidgets::Slider::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int *piVar1;
  int iVar2;
  QColor *pQVar3;
  void *_v_1;
  Slider *_t_1;
  void *_v;
  Slider *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  if (_c == ReadProperty) {
    piVar1 = (int *)*_a;
    if (_id == 0) {
      iVar2 = handleRadius((Slider *)_o);
      *piVar1 = iVar2;
    }
    else if (_id == 1) {
      pQVar3 = highlightColor((Slider *)_o);
      *(undefined8 *)piVar1 = *(undefined8 *)pQVar3;
      piVar1[2] = *(int *)((long)&pQVar3->ct + 4);
      *(ushort *)(piVar1 + 3) = (pQVar3->ct).argb.pad;
    }
    else if (_id == 2) {
      iVar2 = grooveHeight((Slider *)_o);
      *piVar1 = iVar2;
    }
  }
  else if (_c == WriteProperty) {
    pQVar3 = (QColor *)*_a;
    if (_id == 0) {
      setHandleRadius((Slider *)_o,pQVar3->cspec);
    }
    else if (_id == 1) {
      setHighlightColor((Slider *)_o,pQVar3);
    }
    else if (_id == 2) {
      setGrooveHeight((Slider *)_o,pQVar3->cspec);
    }
  }
  return;
}

Assistant:

void QtMWidgets::Slider::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{

#ifndef QT_NO_PROPERTIES
    if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<Slider *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< int*>(_v) = _t->handleRadius(); break;
        case 1: *reinterpret_cast< QColor*>(_v) = _t->highlightColor(); break;
        case 2: *reinterpret_cast< int*>(_v) = _t->grooveHeight(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<Slider *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setHandleRadius(*reinterpret_cast< int*>(_v)); break;
        case 1: _t->setHighlightColor(*reinterpret_cast< QColor*>(_v)); break;
        case 2: _t->setGrooveHeight(*reinterpret_cast< int*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
    (void)_o;
    (void)_id;
    (void)_c;
    (void)_a;
}